

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

plain_range_sorted<CGlyphIndex>
find_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>
          (plain_range_sorted<CGlyphIndex> range,CGlyphIndex value)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  CGlyphIndex *pCVar5;
  plain_range<CGlyphIndex> pVar6;
  CGlyphIndex *pCVar4;
  
  pVar6 = (plain_range<CGlyphIndex>)
          partition_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>(range,value);
  pCVar4 = pVar6.begin;
  if (pCVar4 < pVar6.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    bVar1 = value.m_FontSizeIndex != pCVar4->m_FontSizeIndex;
    bVar2 = value.m_ID != pCVar4->m_ID;
    pCVar5 = pVar6.end;
    if (bVar1 || bVar2) {
      pCVar5 = (CGlyphIndex *)0x0;
    }
    pVar6.end = pCVar5;
    pVar6.begin = pCVar4;
    if (bVar1 || bVar2) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pCVar5;
      pVar6 = (plain_range<CGlyphIndex>)(auVar3 << 0x40);
    }
  }
  return (plain_range_sorted<CGlyphIndex>)pVar6;
}

Assistant:

R find_binary(R range, T value)
{
	range = partition_binary(range, value);
	if(range.empty()) return range;
	if(range.front() == value) return range;
	return R();
}